

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
UA_Client_getEndpoints
          (UA_Client *client,char *serverUrl,size_t *endpointDescriptionsSize,
          UA_EndpointDescription **endpointDescriptions)

{
  UA_ConnectionConfig UVar1;
  UA_UInt32 UVar2;
  UA_UInt32 UVar3;
  UA_UInt32 UVar4;
  UA_StatusCode UVar5;
  UA_String UVar6;
  undefined1 local_c8 [24];
  undefined1 auStack_b0 [120];
  UA_EndpointDescription **local_38;
  
  if (client->state == UA_CLIENTSTATE_CONNECTED) {
    UVar5 = 0;
  }
  else {
    local_38 = endpointDescriptions;
    if (client->state == UA_CLIENTSTATE_ERRORED) {
      UA_Client_deleteMembers(client);
      local_c8._0_4_ = (client->config).timeout;
      local_c8._4_4_ = (client->config).secureChannelLifeTime;
      local_c8._8_8_ = (client->config).logger;
      local_c8._16_4_ = (client->config).localConnectionConfig.protocolVersion;
      local_c8._20_4_ = (client->config).localConnectionConfig.sendBufferSize;
      auStack_b0._0_4_ = (client->config).localConnectionConfig.recvBufferSize;
      auStack_b0._4_4_ = (client->config).localConnectionConfig.maxMessageSize;
      auStack_b0._8_8_ = *(undefined8 *)&(client->config).localConnectionConfig.maxChunkCount;
      auStack_b0._16_8_ = (client->config).connectionFunc;
      memset(client,0,600);
      (client->channel).connection = &client->connection;
      (client->config).timeout = local_c8._0_4_;
      (client->config).secureChannelLifeTime = local_c8._4_4_;
      (client->config).logger = (UA_Logger)local_c8._8_8_;
      (client->config).localConnectionConfig.protocolVersion = local_c8._16_4_;
      (client->config).localConnectionConfig.sendBufferSize = local_c8._20_4_;
      (client->config).localConnectionConfig.recvBufferSize = auStack_b0._0_4_;
      (client->config).localConnectionConfig.maxMessageSize = auStack_b0._4_4_;
      *(undefined8 *)&(client->config).localConnectionConfig.maxChunkCount = auStack_b0._8_8_;
      (client->config).connectionFunc = (UA_ConnectClientConnection)auStack_b0._16_8_;
    }
    UVar1.recvBufferSize = 0xffff;
    UVar1.maxMessageSize = 0;
    UVar1.protocolVersion = 0;
    UVar1.sendBufferSize = 0xffff;
    UVar1.maxChunkCount = 0;
    (*(client->config).connectionFunc)
              ((UA_Connection *)local_c8,UVar1,serverUrl,(client->config).logger);
    memcpy(&client->connection,(UA_Connection *)local_c8,0x88);
    UVar5 = 0x80ae0000;
    if ((client->connection).state == UA_CONNECTION_OPENING) {
      UVar6 = UA_String_fromChars(serverUrl);
      client->endpointUrl = UVar6;
      if (UVar6.data == (UA_Byte *)0x0) {
        UVar5 = 0x80030000;
      }
      else {
        (client->connection).localConf.maxChunkCount =
             (client->config).localConnectionConfig.maxChunkCount;
        UVar2 = (client->config).localConnectionConfig.sendBufferSize;
        UVar3 = (client->config).localConnectionConfig.recvBufferSize;
        UVar4 = (client->config).localConnectionConfig.maxMessageSize;
        (client->connection).localConf.protocolVersion =
             (client->config).localConnectionConfig.protocolVersion;
        (client->connection).localConf.sendBufferSize = UVar2;
        (client->connection).localConf.recvBufferSize = UVar3;
        (client->connection).localConf.maxMessageSize = UVar4;
        UVar5 = HelAckHandshake(client);
        if ((UVar5 == 0) && (UVar5 = SecureChannelHandshake(client,false), UVar5 == 0)) {
          UVar5 = GetEndpoints(client,endpointDescriptionsSize,local_38);
        }
      }
    }
    UA_Client_disconnect(client);
    UA_Client_deleteMembers(client);
    local_c8._0_4_ = (client->config).timeout;
    local_c8._4_4_ = (client->config).secureChannelLifeTime;
    local_c8._8_8_ = (client->config).logger;
    local_c8._16_4_ = (client->config).localConnectionConfig.protocolVersion;
    local_c8._20_4_ = (client->config).localConnectionConfig.sendBufferSize;
    auStack_b0._0_4_ = (client->config).localConnectionConfig.recvBufferSize;
    auStack_b0._4_4_ = (client->config).localConnectionConfig.maxMessageSize;
    auStack_b0._8_8_ = *(undefined8 *)&(client->config).localConnectionConfig.maxChunkCount;
    auStack_b0._16_8_ = (client->config).connectionFunc;
    memset(client,0,600);
    (client->channel).connection = &client->connection;
    (client->config).timeout = local_c8._0_4_;
    (client->config).secureChannelLifeTime = local_c8._4_4_;
    (client->config).logger = (UA_Logger)local_c8._8_8_;
    (client->config).localConnectionConfig.protocolVersion = local_c8._16_4_;
    (client->config).localConnectionConfig.sendBufferSize = local_c8._20_4_;
    (client->config).localConnectionConfig.recvBufferSize = auStack_b0._0_4_;
    (client->config).localConnectionConfig.maxMessageSize = auStack_b0._4_4_;
    *(undefined8 *)&(client->config).localConnectionConfig.maxChunkCount = auStack_b0._8_8_;
    (client->config).connectionFunc = (UA_ConnectClientConnection)auStack_b0._16_8_;
  }
  return UVar5;
}

Assistant:

UA_StatusCode
UA_Client_getEndpoints(UA_Client *client, const char *serverUrl,
                       size_t* endpointDescriptionsSize,
                       UA_EndpointDescription** endpointDescriptions) {
    if(client->state == UA_CLIENTSTATE_CONNECTED)
        return UA_STATUSCODE_GOOD;
    if(client->state == UA_CLIENTSTATE_ERRORED)
        UA_Client_reset(client);


    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    client->connection =
        client->config.connectionFunc(UA_ConnectionConfig_standard, serverUrl,
                                      client->config.logger);
    if(client->connection.state != UA_CONNECTION_OPENING) {
        retval = UA_STATUSCODE_BADCONNECTIONCLOSED;
        goto cleanup;
    }

    client->endpointUrl = UA_STRING_ALLOC(serverUrl);
    if(!client->endpointUrl.data) {
        retval = UA_STATUSCODE_BADOUTOFMEMORY;
        goto cleanup;
    }

    client->connection.localConf = client->config.localConnectionConfig;
    retval = HelAckHandshake(client);
    if(retval == UA_STATUSCODE_GOOD)
        retval = SecureChannelHandshake(client, false);
    if(retval == UA_STATUSCODE_GOOD)
        retval = GetEndpoints(client, endpointDescriptionsSize, endpointDescriptions);

    /* always cleanup */
 cleanup:
    UA_Client_disconnect(client);
    UA_Client_reset(client);
    return retval;
}